

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O3

BSDFSample * __thiscall
pbrt::HairBxDF::Sample_f
          (BSDFSample *__return_storage_ptr__,HairBxDF *this,Vector3f wo,Float uc,Point2f *u,
          TransportMode mode,BxDFReflTransFlags sampleFlags)

{
  Float FVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  bool bVar5;
  Float sinTheta_o;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  long lVar11;
  TransportMode mode_00;
  code *pcVar12;
  int p;
  long in_FS_OFFSET;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float sinTheta_o_00;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  Float FVar20;
  float fVar21;
  Float FVar22;
  undefined1 auVar24 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar25 [16];
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar26 [64];
  undefined1 auVar23 [16];
  undefined1 auVar32 [56];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  Float FVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar39 [16];
  undefined4 in_XMM5_Da;
  undefined1 in_register_00001344 [12];
  array<float,_4> aVar40;
  SampledSpectrum SVar41;
  Vector3f wi;
  array<float,_4> apPDF;
  float local_f0;
  float local_e8;
  float fStack_c4;
  undefined8 uStack_c0;
  ulong uStack_a0;
  undefined1 local_98 [16];
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  uint uStack_40;
  uint uStack_3c;
  undefined1 local_38 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 auVar38 [56];
  
  auVar26._8_56_ = wo._8_56_;
  auVar26._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  sinTheta_o_00 = wo.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar23 = auVar26._0_16_;
  auVar34 = vmovshdup_avx(auVar23);
  auVar38 = ZEXT856(auVar34._8_8_);
  auVar3 = vmaxss_avx(ZEXT416((uint)(1.0 - sinTheta_o_00 * sinTheta_o_00)),ZEXT816(0));
  auVar3 = vsqrtss_avx(auVar3,auVar3);
  pcVar12 = (code *)this;
  fVar15 = atan2f(wo.super_Tuple3<pbrt::Vector3,_float>.z,auVar34._0_4_);
  uStack_a0 = auVar3._8_8_;
  auVar32 = ZEXT856(uStack_a0);
  FVar22 = auVar3._0_4_;
  aVar40 = ComputeApPDF(this,FVar22);
  auVar36._0_8_ = aVar40.values._8_8_;
  auVar36._8_56_ = auVar38;
  auVar27._0_8_ = aVar40.values._0_8_;
  auVar27._8_56_ = auVar32;
  local_58 = vmovlhps_avx(auVar27._0_16_,auVar36._0_16_);
  lVar11 = 0;
  fVar17 = 0.0;
  do {
    fVar17 = fVar17 + *(float *)(local_58 + lVar11);
    lVar11 = lVar11 + 4;
  } while (lVar11 != 0x10);
  lVar11 = 0;
  do {
    if (uc < *(float *)(local_58 + lVar11 * 4) / fVar17) goto LAB_00376f3c;
    uc = uc - *(float *)(local_58 + lVar11 * 4) / fVar17;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 4);
  lVar11 = 4;
LAB_00376f3c:
  if ((SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg == '\0') &&
     (iVar10 = __cxa_guard_acquire(&SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg
                                  ), iVar10 != 0)) {
    pcVar12 = SampleDiscrete(pstd::span<float_const>,float,float*,float*)::
              {lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__;
    StatRegisterer::StatRegisterer
              ((StatRegisterer *)&SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg,
               SampleDiscrete(pstd::span<float_const>,float,float*,float*)::
               {lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,(PixelAccumFunc)0x0);
    __cxa_guard_release(&SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg);
  }
  *(long *)(in_FS_OFFSET + -0x760) = *(long *)(in_FS_OFFSET + -0x760) + 1;
  if (lVar11 == 4) {
    *(long *)(in_FS_OFFSET + -0x768) = *(long *)(in_FS_OFFSET + -0x768) + 1;
    lVar11 = 3;
    auVar34 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                         ZEXT416((uint)(uc / ((float)local_58._12_4_ / fVar17))));
    local_e8 = auVar34._0_4_;
LAB_00376f99:
    iVar10 = (int)lVar11;
    local_f0 = sinTheta_o_00;
    fVar17 = FVar22;
  }
  else {
    iVar10 = (int)lVar11;
    auVar34 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                         ZEXT416((uint)(uc / (*(float *)(local_58 + (long)iVar10 * 4) / fVar17))));
    local_e8 = auVar34._0_4_;
    if (iVar10 == 2) {
      FVar33 = this->sin2kAlpha[2];
      FVar20 = this->cos2kAlpha[2];
      iVar10 = 2;
    }
    else {
      if (iVar10 != 1) {
        if (iVar10 == 0) {
          iVar10 = 0;
          auVar34 = vfmsub231ss_fma(ZEXT416((uint)(this->sin2kAlpha[1] * FVar22)),auVar23,
                                    ZEXT416((uint)this->cos2kAlpha[1]));
          local_f0 = auVar34._0_4_;
          auVar34 = vfmadd231ss_fma(ZEXT416((uint)(sinTheta_o_00 * this->sin2kAlpha[1])),auVar3,
                                    ZEXT416((uint)this->cos2kAlpha[1]));
          fVar17 = auVar34._0_4_;
          goto LAB_0037707f;
        }
        goto LAB_00376f99;
      }
      FVar33 = this->sin2kAlpha[0];
      FVar20 = this->cos2kAlpha[0];
      iVar10 = 1;
    }
    auVar34 = vfmadd231ss_fma(ZEXT416((uint)(FVar22 * FVar33)),auVar23,ZEXT416((uint)FVar20));
    local_f0 = auVar34._0_4_;
    auVar34 = vfmsub231ss_fma(ZEXT416((uint)(FVar33 * sinTheta_o_00)),auVar3,ZEXT416((uint)FVar20));
    fVar17 = auVar34._0_4_;
  }
LAB_0037707f:
  fVar19 = (u->super_Tuple2<pbrt::Point2,_float>).x;
  fVar16 = this->v[iVar10];
  auVar34 = vmaxss_avx(SUB6416(ZEXT464(0x3727c5ac),0),ZEXT416((uint)fVar19));
  auVar28._0_4_ = expf(-2.0 / fVar16);
  auVar28._4_60_ = extraout_var;
  auVar34 = vfmadd213ss_fma(auVar28._0_16_,ZEXT416((uint)(1.0 - fVar19)),ZEXT416(auVar34._0_4_));
  auVar29._0_4_ = logf(auVar34._0_4_);
  auVar29._4_60_ = extraout_var_00;
  auVar34 = vfmadd132ss_fma(auVar29._0_16_,SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)fVar16));
  fVar19 = auVar34._0_4_;
  auVar34._0_12_ = ZEXT812(0);
  auVar34._12_4_ = 0;
  auVar34 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar19 * fVar19)),auVar34);
  auVar34 = vsqrtss_avx(auVar34,auVar34);
  fVar16 = cosf((u->super_Tuple2<pbrt::Point2,_float>).y * 6.2831855);
  auVar6 = vfnmadd231ss_fma(ZEXT416((uint)(fVar16 * auVar34._0_4_ * fVar17)),ZEXT416((uint)fVar19),
                            ZEXT416((uint)local_f0));
  auVar34 = vfmsub213ss_fma(ZEXT416((uint)this->eta),ZEXT416((uint)this->eta),
                            ZEXT416((uint)(sinTheta_o_00 * sinTheta_o_00)));
  fVar17 = auVar6._0_4_;
  auVar34 = vmaxss_avx(auVar34,ZEXT816(0) << 0x40);
  auVar14 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar17 * fVar17)),ZEXT816(0) << 0x40);
  auVar34 = vsqrtss_avx(auVar34,auVar34);
  auVar24 = ZEXT416((uint)(this->h / (auVar34._0_4_ / FVar22)));
  auVar34 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar24);
  uVar4 = vcmpss_avx512f(auVar24,SUB6416(ZEXT464(0xbf800000),0),1);
  bVar5 = (bool)((byte)uVar4 & 1);
  auVar30._0_4_ = asinf((float)((uint)bVar5 * -0x40800000 + (uint)!bVar5 * auVar34._0_4_));
  auVar30._4_60_ = extraout_var_01;
  if (iVar10 < 3) {
    fVar19 = this->s;
    auVar39._0_4_ = (float)(iVar10 * 2);
    auVar39._4_12_ = in_register_00001344;
    auVar34 = vfmadd231ss_fma(ZEXT416((uint)(this->gamma_o * -2.0)),auVar30._0_16_,auVar39);
    auVar24._0_4_ = (float)iVar10;
    auVar24._4_12_ = in_register_00001344;
    auVar24 = vfmadd213ss_fma(auVar24,SUB6416(ZEXT464(0x40490fdb),0),auVar34);
    fVar16 = expf(3.1415927 / fVar19);
    fVar18 = expf(-3.1415927 / fVar19);
    auVar34 = vfmadd231ss_fma(ZEXT416((uint)(local_e8 * (1.0 / (fVar18 + 1.0)))),
                              ZEXT416((uint)(1.0 - local_e8)),ZEXT416((uint)(1.0 / (fVar16 + 1.0))))
    ;
    auVar13._8_4_ = 0x80000000;
    auVar13._0_8_ = 0x8000000080000000;
    auVar13._12_4_ = 0x80000000;
    auVar13 = vxorps_avx512vl(ZEXT416((uint)fVar19),auVar13);
    fVar19 = logf(1.0 / auVar34._0_4_ + -1.0);
    local_e8 = auVar13._0_4_;
    auVar34 = vminss_avx(SUB6416(ZEXT464(0x40490fdb),0),ZEXT416((uint)(fVar19 * local_e8)));
    uVar4 = vcmpss_avx512f(ZEXT416((uint)(fVar19 * local_e8)),SUB6416(ZEXT464(0xc0490fdb),0),1);
    bVar5 = (bool)((byte)uVar4 & 1);
    local_e8 = (float)((uint)bVar5 * -0x3fb6f025 + (uint)!bVar5 * auVar34._0_4_) + auVar24._0_4_;
  }
  else {
    local_e8 = local_e8 * 6.2831855;
  }
  auVar9._4_12_ = in_register_00001344;
  auVar9._0_4_ = in_XMM5_Da;
  auVar34 = vsqrtss_avx(auVar9,ZEXT416(auVar14._0_4_));
  FVar33 = auVar34._0_4_;
  fVar19 = cosf(local_e8 + fVar15);
  fVar15 = sinf(local_e8 + fVar15);
  auVar34 = ZEXT816(0) << 0x40;
  lVar11 = 0;
  fStack_c4 = wo.super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_c0._0_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_c0._4_4_ = wo._12_4_;
  local_48 = -sinTheta_o_00;
  fStack_44 = -fStack_c4;
  uStack_40 = (uint)uStack_c0 ^ 0x80000000;
  uStack_3c = uStack_c0._4_4_ ^ 0x80000000;
  local_38._0_8_ = auVar3._0_8_ ^ 0x8000000080000000;
  local_38._8_4_ = auVar3._8_4_ ^ 0x80000000;
  local_38._12_4_ = auVar3._12_4_ ^ 0x80000000;
  do {
    iVar10 = (int)lVar11;
    if (iVar10 == 2) {
      FVar20 = this->sin2kAlpha[2];
      FVar1 = this->cos2kAlpha[2];
LAB_00377356:
      auVar14 = vfmadd231ss_fma(ZEXT416((uint)(FVar22 * FVar20)),ZEXT416((uint)FVar1),
                                ZEXT416((uint)sinTheta_o_00));
      sinTheta_o = auVar14._0_4_;
      auVar14 = vfmadd231ss_fma(ZEXT416((uint)(FVar20 * local_48)),auVar3,ZEXT416((uint)FVar1));
    }
    else {
      if (iVar10 == 1) {
        FVar20 = this->sin2kAlpha[0];
        FVar1 = this->cos2kAlpha[0];
        goto LAB_00377356;
      }
      auVar14 = vfmadd231ss_fma(ZEXT416((uint)(sinTheta_o_00 * this->sin2kAlpha[1])),
                                ZEXT416((uint)this->cos2kAlpha[1]),ZEXT416((uint)FVar22));
      auVar24 = vfmadd231ss_fma(ZEXT416((uint)(this->sin2kAlpha[1] * (float)local_38._0_4_)),auVar23
                                ,ZEXT416((uint)this->cos2kAlpha[1]));
      sinTheta_o = auVar24._0_4_;
    }
    auVar7._8_4_ = 0x7fffffff;
    auVar7._0_8_ = 0x7fffffff7fffffff;
    auVar7._12_4_ = 0x7fffffff;
    auVar14 = vandps_avx512vl(auVar14,auVar7);
    FVar20 = Mp(FVar33,auVar14._0_4_,fVar17,sinTheta_o,this->v[lVar11]);
    auVar14._0_4_ = (float)(iVar10 * 2);
    auVar14._4_12_ = in_register_00001344;
    auVar14 = vfmadd231ss_fma(ZEXT416((uint)(this->gamma_o * -2.0)),auVar14,
                              ZEXT416((uint)auVar30._0_4_));
    auVar35._0_4_ = (float)iVar10;
    auVar35._4_12_ = in_register_00001344;
    auVar14 = vfmadd213ss_fma(auVar35,SUB6416(ZEXT464(0x40490fdb),0),auVar14);
    for (fVar16 = local_e8 - auVar14._0_4_; 3.1415927 < fVar16; fVar16 = fVar16 + -6.2831855) {
    }
    fVar18 = *(float *)(local_58 + lVar11 * 4);
    fVar2 = this->s;
    for (; fVar16 < -3.1415927; fVar16 = fVar16 + 6.2831855) {
    }
    auVar8._8_4_ = 0x80000000;
    auVar8._0_8_ = 0x8000000080000000;
    auVar8._12_4_ = 0x80000000;
    auVar14 = vorps_avx512vl(ZEXT416((uint)fVar16),auVar8);
    fVar16 = auVar14._0_4_ / fVar2;
    local_98._0_4_ = expf(fVar16);
    local_98._4_4_ = extraout_XMM0_Db;
    local_98._8_4_ = extraout_XMM0_Dc;
    local_98._12_4_ = extraout_XMM0_Dd;
    fVar16 = expf(fVar16);
    fVar21 = expf(-3.1415927 / fVar2);
    auVar24 = vinsertps_avx(ZEXT416((uint)(fVar2 * (fVar16 + 1.0) * (fVar16 + 1.0))),
                            ZEXT416((uint)(fVar21 + 1.0)),0x10);
    auVar14 = vblendps_avx(local_98,_DAT_00606c80,0xe);
    auVar14 = vdivps_avx(auVar14,auVar24);
    fVar16 = expf(3.1415927 / fVar2);
    mode_00 = (TransportMode)pcVar12;
    lVar11 = lVar11 + 1;
    auVar24 = vmovshdup_avx(auVar14);
    auVar25._0_4_ = auVar14._0_4_ / (auVar24._0_4_ - 1.0 / (fVar16 + 1.0));
    auVar25._4_12_ = auVar14._4_12_;
    auVar34 = vfmadd231ss_fma(ZEXT416(auVar34._0_4_),auVar25,ZEXT416((uint)(FVar20 * fVar18)));
    if (lVar11 == 3) {
      FVar22 = Mp(FVar33,FVar22,fVar17,sinTheta_o_00,this->v[3]);
      auVar23 = vfmadd231ss_fma(ZEXT416(auVar34._0_4_),
                                ZEXT416((uint)(FVar22 * (float)local_58._12_4_)),ZEXT416(0x3e22f983)
                               );
      auVar3 = vinsertps_avx(auVar6,ZEXT416((uint)(FVar33 * fVar19)),0x10);
      uStack_c0 = wo._8_8_;
      auVar38 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
      auVar32 = ZEXT856(uStack_c0);
      wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar3._0_8_;
      wi.super_Tuple3<pbrt::Vector3,_float>.z = FVar33 * fVar15;
      SVar41 = f(this,wo,wi,mode_00);
      auVar37._0_8_ = SVar41.values.values._8_8_;
      auVar37._8_56_ = auVar38;
      auVar31._0_8_ = SVar41.values.values._0_8_;
      auVar31._8_56_ = auVar32;
      auVar34 = vmovlhps_avx(auVar31._0_16_,auVar37._0_16_);
      *(undefined1 (*) [16])(__return_storage_ptr__->f).values.values = auVar34;
      uVar4 = vmovlps_avx(auVar3);
      (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar4;
      (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)uVar4 >> 0x20);
      (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = FVar33 * fVar15;
      __return_storage_ptr__->pdf = auVar23._0_4_;
      __return_storage_ptr__->flags = GlossyReflection;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

BSDFSample HairBxDF::Sample_f(Vector3f wo, Float uc, const Point2f &u, TransportMode mode,
                              BxDFReflTransFlags sampleFlags) const {
    // Compute hair coordinate system terms related to _wo_
    Float sinTheta_o = wo.x;
    Float cosTheta_o = SafeSqrt(1 - Sqr(sinTheta_o));
    Float phi_o = std::atan2(wo.z, wo.y);

    // Determine which term $p$ to sample for hair scattering
    pstd::array<Float, pMax + 1> apPDF = ComputeApPDF(cosTheta_o);
    int p = SampleDiscrete(apPDF, uc, nullptr, &uc);

    // Rotate $\sin \thetao$ and $\cos \thetao$ to account for hair scale tilt
    Float sinThetap_o, cosThetap_o;
    if (p == 0) {
        sinThetap_o = sinTheta_o * cos2kAlpha[1] - cosTheta_o * sin2kAlpha[1];
        cosThetap_o = cosTheta_o * cos2kAlpha[1] + sinTheta_o * sin2kAlpha[1];
    } else if (p == 1) {
        sinThetap_o = sinTheta_o * cos2kAlpha[0] + cosTheta_o * sin2kAlpha[0];
        cosThetap_o = cosTheta_o * cos2kAlpha[0] - sinTheta_o * sin2kAlpha[0];
    } else if (p == 2) {
        sinThetap_o = sinTheta_o * cos2kAlpha[2] + cosTheta_o * sin2kAlpha[2];
        cosThetap_o = cosTheta_o * cos2kAlpha[2] - sinTheta_o * sin2kAlpha[2];
    } else {
        sinThetap_o = sinTheta_o;
        cosThetap_o = cosTheta_o;
    }

    // Sample $M_p$ to compute $\thetai$
    Float cosTheta = 1 + v[p] * std::log(std::max<Float>(u[0], 1e-5) +
                                         (1 - u[0]) * std::exp(-2 / v[p]));
    Float sinTheta = SafeSqrt(1 - Sqr(cosTheta));
    Float cosPhi = std::cos(2 * Pi * u[1]);
    Float sinTheta_i = -cosTheta * sinThetap_o + sinTheta * cosPhi * cosThetap_o;
    Float cosTheta_i = SafeSqrt(1 - Sqr(sinTheta_i));

    // Sample $N_p$ to compute $\Delta\phi$
    // Compute $\gammat$ for refracted ray
    Float etap = SafeSqrt(eta * eta - Sqr(sinTheta_o)) / cosTheta_o;
    Float sinGamma_t = h / etap;
    Float cosGamma_t = SafeSqrt(1 - Sqr(sinGamma_t));
    Float gamma_t = SafeASin(sinGamma_t);

    Float dphi;
    if (p < pMax)
        dphi = Phi(p, gamma_o, gamma_t) + SampleTrimmedLogistic(uc, s, -Pi, Pi);
    else
        dphi = 2 * Pi * uc;

    // Compute _wi_ from sampled hair scattering angles
    Float phi_i = phi_o + dphi;
    Vector3f wi(sinTheta_i, cosTheta_i * std::cos(phi_i), cosTheta_i * std::sin(phi_i));

    // Compute PDF for sampled hair scattering direction _wi_
    Float pdf = 0;
    for (int p = 0; p < pMax; ++p) {
        // Rotate $\sin \thetao$ and $\cos \thetao$ to account for hair scale tilt
        Float sinThetap_o, cosThetap_o;
        if (p == 0) {
            sinThetap_o = sinTheta_o * cos2kAlpha[1] - cosTheta_o * sin2kAlpha[1];
            cosThetap_o = cosTheta_o * cos2kAlpha[1] + sinTheta_o * sin2kAlpha[1];
        } else if (p == 1) {
            sinThetap_o = sinTheta_o * cos2kAlpha[0] + cosTheta_o * sin2kAlpha[0];
            cosThetap_o = cosTheta_o * cos2kAlpha[0] - sinTheta_o * sin2kAlpha[0];
        } else if (p == 2) {
            sinThetap_o = sinTheta_o * cos2kAlpha[2] + cosTheta_o * sin2kAlpha[2];
            cosThetap_o = cosTheta_o * cos2kAlpha[2] - sinTheta_o * sin2kAlpha[2];
        } else {
            sinThetap_o = sinTheta_o;
            cosThetap_o = cosTheta_o;
        }

        // Handle out-of-range $\cos \thetao$ from scale adjustment
        cosThetap_o = std::abs(cosThetap_o);

        pdf += Mp(cosTheta_i, cosThetap_o, sinTheta_i, sinThetap_o, v[p]) * apPDF[p] *
               Np(dphi, p, s, gamma_o, gamma_t);
    }
    pdf += Mp(cosTheta_i, cosTheta_o, sinTheta_i, sinTheta_o, v[pMax]) * apPDF[pMax] *
           (1 / (2 * Pi));
    // if (std::abs(wi->x) < .9999) CHECK_NEAR(*pdf, PDF(wo, *wi), .01);

    return BSDFSample(f(wo, wi, mode), wi, pdf, Flags());
}